

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

void __thiscall
ktx::Command::parseCommandLine(Command *this,string *name,string *desc,int argc,char **argv)

{
  string *in_RDX;
  string *in_RSI;
  ParseResult *in_RDI;
  parsing *ex;
  ParseResult args;
  Options commandOpts;
  ParseResult *in_stack_fffffffffffffc78;
  Options *in_stack_fffffffffffffc80;
  allocator<char> *in_stack_fffffffffffffcb0;
  char *in_stack_fffffffffffffcb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcc0;
  string *in_stack_fffffffffffffce0;
  string *in_stack_fffffffffffffce8;
  Options *in_stack_fffffffffffffcf0;
  char **in_stack_fffffffffffffd58;
  int in_stack_fffffffffffffd64;
  Options *in_stack_fffffffffffffd68;
  undefined1 local_288 [191];
  allocator<char> local_1c9;
  string local_1c8 [55];
  allocator<char> local_191;
  string local_190 [32];
  string local_170 [32];
  Options local_150;
  string *local_18;
  string *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::string::operator=((string *)&(in_RDI->m_keys)._M_h._M_bucket_count,in_RSI);
  std::__cxx11::string::operator=
            ((string *)&(in_RDI->m_keys)._M_h._M_rehash_policy._M_next_resize,local_18);
  std::__cxx11::string::string(local_170,local_10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  cxxopts::Options::Options
            (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator(&local_191);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  cxxopts::Options::custom_help(in_stack_fffffffffffffc80,(string *)in_stack_fffffffffffffc78);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  cxxopts::Options::set_width(&local_150,100);
  (*(code *)(in_RDI->m_keys)._M_h._M_buckets[3])(in_RDI,&local_150);
  cxxopts::ParseResult::ParseResult(in_RDI);
  cxxopts::Options::parse
            (in_stack_fffffffffffffd68,in_stack_fffffffffffffd64,in_stack_fffffffffffffd58);
  cxxopts::ParseResult::operator=
            ((ParseResult *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  cxxopts::ParseResult::~ParseResult((ParseResult *)in_stack_fffffffffffffc80);
  (*(code *)(in_RDI->m_keys)._M_h._M_buckets[4])(in_RDI,&local_150,local_288);
  cxxopts::ParseResult::~ParseResult((ParseResult *)in_stack_fffffffffffffc80);
  cxxopts::Options::~Options(in_stack_fffffffffffffc80);
  return;
}

Assistant:

void Command::parseCommandLine(const std::string& name, const std::string& desc, int argc, char* argv[]) {
    commandName = name;
    commandDescription = desc;

    cxxopts::Options commandOpts(name, "");
    commandOpts.custom_help("[OPTION...]");
    commandOpts.set_width(CONSOLE_USAGE_WIDTH);
    initOptions(commandOpts); // virtual customization point

    cxxopts::ParseResult args;
    try {
        args = commandOpts.parse(argc, argv);
        processOptions(commandOpts, args); // virtual customization point

    } catch (const cxxopts::exceptions::parsing& ex) {
        fatal_usage("{}.", ex.what());
    }

#if defined(_WIN32) && defined(DEBUG)
    if (args["ld"].as<bool>())
        launchDebugger();
#endif
}